

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O3

void update_ext_partition_context
               (MACROBLOCKD *xd,int mi_row,int mi_col,BLOCK_SIZE subsize,BLOCK_SIZE bsize,
               PARTITION_TYPE partition)

{
  byte bVar1;
  ulong __n;
  long lVar2;
  PARTITION_CONTEXT *__s;
  uint uVar3;
  ulong uVar4;
  
  if (bsize < BLOCK_8X8) {
    return;
  }
  uVar4 = 0xff;
  switch(bsize) {
  case BLOCK_16X16:
    lVar2 = 2;
    break;
  case BLOCK_16X32:
  case BLOCK_32X16:
  case BLOCK_32X64:
  case BLOCK_64X32:
  case BLOCK_64X128:
  case BLOCK_128X64:
    goto switchD_001ef7f6_caseD_7;
  case BLOCK_32X32:
    lVar2 = 3;
    break;
  case BLOCK_64X64:
    lVar2 = 4;
    break;
  case BLOCK_128X128:
    lVar2 = 5;
    break;
  default:
    lVar2 = 1;
    if (bsize != BLOCK_8X8) goto switchD_001ef7f6_caseD_7;
  }
  uVar4 = (ulong)subsize_lookup[3][lVar2];
switchD_001ef7f6_caseD_7:
  if (9 < partition) {
    return;
  }
  uVar3 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize]
                >> 1);
  switch(partition) {
  case '\x03':
    if (bsize != BLOCK_8X8) {
      return;
    }
  default:
    __s = xd->left_partition_context + (mi_row & 0x1f);
    __n = (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize]
    ;
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[subsize].above,
           (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [bsize]);
    uVar3 = (uint)(byte)partition_context_lookup[subsize].left;
    break;
  case '\x04':
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[subsize];
    __n = (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [subsize];
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[uVar4].above,
           (ulong)bVar1);
    memset(xd->left_partition_context + (mi_row & 0x1f),
           (uint)(byte)partition_context_lookup[uVar4].left,__n);
    __s = xd->left_partition_context + (uVar3 + mi_row & 0x1f);
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[subsize].above,
           (ulong)bVar1);
    uVar3 = (uint)(byte)partition_context_lookup[subsize].left;
    break;
  case '\x05':
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[subsize];
    __n = (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [subsize];
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[subsize].above,
           (ulong)bVar1);
    memset(xd->left_partition_context + (mi_row & 0x1f),
           (uint)(byte)partition_context_lookup[subsize].left,__n);
    __s = xd->left_partition_context + (uVar3 + mi_row & 0x1f);
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[uVar4].above,
           (ulong)bVar1);
    uVar3 = (uint)(byte)partition_context_lookup[uVar4].left;
    break;
  case '\x06':
    __s = xd->left_partition_context + (mi_row & 0x1f);
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[subsize];
    __n = (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [subsize];
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[uVar4].above,
           (ulong)bVar1);
    memset(__s,(uint)(byte)partition_context_lookup[uVar4].left,__n);
    memset(xd->above_partition_context + (int)(uVar3 + mi_col),
           (uint)(byte)partition_context_lookup[subsize].above,(ulong)bVar1);
    uVar3 = (uint)(byte)partition_context_lookup[subsize].left;
    break;
  case '\a':
    __s = xd->left_partition_context + (mi_row & 0x1f);
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[subsize];
    __n = (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [subsize];
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[subsize].above,
           (ulong)bVar1);
    memset(__s,(uint)(byte)partition_context_lookup[subsize].left,__n);
    memset(xd->above_partition_context + (int)(uVar3 + mi_col),
           (uint)(byte)partition_context_lookup[uVar4].above,(ulong)bVar1);
    uVar3 = (uint)(byte)partition_context_lookup[uVar4].left;
  }
  memset(__s,uVar3,__n);
  return;
}

Assistant:

static inline void update_ext_partition_context(MACROBLOCKD *xd, int mi_row,
                                                int mi_col, BLOCK_SIZE subsize,
                                                BLOCK_SIZE bsize,
                                                PARTITION_TYPE partition) {
  if (bsize >= BLOCK_8X8) {
    const int hbs = mi_size_wide[bsize] / 2;
    BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
    switch (partition) {
      case PARTITION_SPLIT:
        if (bsize != BLOCK_8X8) break;
        AOM_FALLTHROUGH_INTENDED;
      case PARTITION_NONE:
      case PARTITION_HORZ:
      case PARTITION_VERT:
      case PARTITION_HORZ_4:
      case PARTITION_VERT_4:
        update_partition_context(xd, mi_row, mi_col, subsize, bsize);
        break;
      case PARTITION_HORZ_A:
        update_partition_context(xd, mi_row, mi_col, bsize2, subsize);
        update_partition_context(xd, mi_row + hbs, mi_col, subsize, subsize);
        break;
      case PARTITION_HORZ_B:
        update_partition_context(xd, mi_row, mi_col, subsize, subsize);
        update_partition_context(xd, mi_row + hbs, mi_col, bsize2, subsize);
        break;
      case PARTITION_VERT_A:
        update_partition_context(xd, mi_row, mi_col, bsize2, subsize);
        update_partition_context(xd, mi_row, mi_col + hbs, subsize, subsize);
        break;
      case PARTITION_VERT_B:
        update_partition_context(xd, mi_row, mi_col, subsize, subsize);
        update_partition_context(xd, mi_row, mi_col + hbs, bsize2, subsize);
        break;
      default: assert(0 && "Invalid partition type");
    }
  }
}